

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialQueue.cpp
# Opt level: O0

void __thiscall llbuild::basic::SerialQueue::async(SerialQueue *this,function<void_()> *fn)

{
  SerialQueueImpl *this_00;
  function<void_()> local_38;
  function<void_()> *local_18;
  function<void_()> *fn_local;
  SerialQueue *this_local;
  
  this_00 = (SerialQueueImpl *)this->impl;
  local_18 = fn;
  fn_local = (function<void_()> *)this;
  std::function<void_()>::function(&local_38,fn);
  anon_unknown.dwarf_a9701::SerialQueueImpl::async(this_00,&local_38);
  std::function<void_()>::~function(&local_38);
  return;
}

Assistant:

void SerialQueue::async(std::function<void(void)> fn) {
  static_cast<SerialQueueImpl*>(impl)->async(fn);
}